

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *o;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *err;
  SQChar *str;
  
  o = stack_get(v,2);
  bVar1 = SQVM::IsFalse(o);
  if (!bVar1) {
    return 0;
  }
  SVar2 = sq_gettop(v);
  if ((2 < SVar2) && (SVar3 = sq_tostring(v,3), -1 < SVar3)) {
    str = (SQChar *)0x0;
    SVar3 = sq_getstring(v,-1,&str);
    err = str;
    if (-1 < SVar3) goto LAB_0015f856;
  }
  err = "assertion failed";
LAB_0015f856:
  SVar3 = sq_throwerror(v,err);
  return SVar3;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        SQInteger top = sq_gettop(v);
        if (top>2 && SQ_SUCCEEDED(sq_tostring(v,3))) {
            const SQChar *str = 0;
            if (SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
                return sq_throwerror(v, str);
            }
        }
        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}